

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_TakeStepMRISR(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  ARKodeMRIStepMem step_mem;
  MRIStepInnerStepper_Ops p_Var1;
  MRIStepInnerSetRTol p_Var2;
  MRIStepInnerResetFn p_Var3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  undefined4 uVar9;
  N_Vector p_Var10;
  int error_code;
  char *msgfmt;
  ulong uVar11;
  MRIStepInnerStepper p_Var12;
  ulong uVar13;
  double dVar14;
  sunrealtype sVar15;
  int nvec;
  int local_58;
  int local_54;
  double local_50;
  N_Vector local_48;
  ulong local_40;
  sunrealtype *local_38;
  
  step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeMRIStepMem)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar5 = -0x15;
    error_code = -0x15;
    iVar4 = 0xc0f;
    goto LAB_0015777b;
  }
  *nflagPtr = 0;
  *dsmPtr = 0.0;
  p_Var10 = ark_mem->tempv4;
  local_38 = dsmPtr;
  iVar4 = SUNAdaptController_GetType(ark_mem->hadapt_mem->hcontroller);
  if (iVar4 != 2) goto LAB_001576eb;
  step_mem->inner_dsm = 0.0;
  p_Var12 = step_mem->stepper;
  if ((p_Var12 != (MRIStepInnerStepper)0x0) &&
     (p_Var1 = p_Var12->ops, p_Var1 != (MRIStepInnerStepper_Ops)0x0)) {
    if (p_Var1->geterror == (MRIStepInnerGetAccumulatedError)0x0) {
LAB_00157692:
      if (p_Var12->ops == (MRIStepInnerStepper_Ops)0x0) {
LAB_001576bf:
        msgfmt = "Unable to set the inner stepper tolerance";
        iVar5 = -0x22;
        error_code = -0x22;
        iVar4 = 0x91b;
        goto LAB_0015777b;
      }
      p_Var2 = p_Var12->ops->setrtol;
      if (p_Var2 != (MRIStepInnerSetRTol)0x0) {
        iVar5 = (*p_Var2)(p_Var12,step_mem->inner_rtol_factor * ark_mem->reltol);
        p_Var12->last_flag = iVar5;
        if (iVar5 != 0) goto LAB_001576bf;
      }
LAB_001576eb:
      if (ark_mem->fixedstep == 0) {
        p_Var12 = step_mem->stepper;
        if ((p_Var12 == (MRIStepInnerStepper)0x0) || (p_Var12->ops == (MRIStepInnerStepper_Ops)0x0))
        {
LAB_00157754:
          msgfmt = "Unable to reset the inner stepper";
          iVar5 = -0x22;
          error_code = -0x22;
          iVar4 = 0x928;
          goto LAB_0015777b;
        }
        p_Var3 = p_Var12->ops->reset;
        if (p_Var3 != (MRIStepInnerResetFn)0x0) {
          iVar5 = (*p_Var3)(p_Var12,ark_mem->tn,ark_mem->yn);
          p_Var12->last_flag = iVar5;
          if (iVar5 != 0) goto LAB_00157754;
        }
      }
      local_54 = iVar4;
      local_48 = p_Var10;
      if (step_mem->expforcing == 0) {
        bVar7 = step_mem->impforcing != 0;
        p_Var10 = ark_mem->fn;
        if (p_Var10 == (N_Vector)0x0 || bVar7) goto LAB_001577be;
      }
      else {
        bVar7 = true;
LAB_001577be:
        iVar4 = mriStep_UpdateF0(ark_mem,step_mem,ark_mem->tn,ark_mem->yn,0);
        if (iVar4 != 0) {
          return -8;
        }
        p_Var10 = ark_mem->fn;
        if ((bool)(p_Var10 != (N_Vector)0x0 & bVar7)) {
          if (step_mem->implicit_rhs != 0) {
            if (step_mem->explicit_rhs == 0) {
              N_VScale(0x3ff0000000000000,*step_mem->Fsi,p_Var10);
            }
            else {
              N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,*step_mem->Fsi,*step_mem->Fse);
            }
          }
          p_Var10 = ark_mem->fn;
        }
        if (p_Var10 == (N_Vector)0x0) goto LAB_00157843;
      }
      if ((ark_mem->fn_is_current == 0) &&
         (iVar4 = mriStep_FullRHS(ark_mem,ark_mem->tn,ark_mem->yn,p_Var10,0), iVar4 != 0)) {
        return -8;
      }
LAB_00157843:
      ark_mem->fn_is_current = 1;
      if ((step_mem->implicit_rhs != 0) && (step_mem->explicit_rhs != 0)) {
        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,*step_mem->Fse,*step_mem->Fsi,
                     *step_mem->Fse);
      }
      iVar4 = ark_mem->fixedstep;
      if ((iVar4 == 0) || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) {
        uVar8 = step_mem->stages + 1;
      }
      else {
        uVar8 = step_mem->stages;
      }
      p_Var10 = local_48;
      if (1 < (int)uVar8) {
        local_40 = (ulong)uVar8;
        uVar13 = 1;
        do {
          uVar8 = step_mem->stages;
          uVar11 = (ulong)uVar8;
          N_VScale(0x3ff0000000000000,ark_mem->yn,ark_mem->ycur);
          local_50 = 1.0;
          if (uVar13 != uVar11) {
            local_50 = step_mem->MRIC->c[uVar13];
          }
          iVar5 = (int)uVar13;
          iVar4 = mriStep_ComputeInnerForcing
                            (ark_mem,step_mem,iVar5,ark_mem->tn,ark_mem->h * local_50 + ark_mem->tn)
          ;
          if (iVar4 != 0) {
            return iVar4;
          }
          sVar15 = ark_mem->tn;
          p_Var10 = ark_mem->ycur;
          if (1 < uVar13) {
            p_Var12 = step_mem->stepper;
            if ((p_Var12 == (MRIStepInnerStepper)0x0) ||
               (p_Var12->ops == (MRIStepInnerStepper_Ops)0x0)) {
LAB_00157fb6:
              msgfmt = "Unable to reset the inner stepper";
              iVar5 = -0x22;
              error_code = -0x22;
              iVar4 = 0x999;
              goto LAB_0015777b;
            }
            p_Var3 = p_Var12->ops->reset;
            if (p_Var3 != (MRIStepInnerResetFn)0x0) {
              iVar4 = (*p_Var3)(p_Var12,sVar15,p_Var10);
              p_Var12->last_flag = iVar4;
              if (iVar4 != 0) goto LAB_00157fb6;
              sVar15 = ark_mem->tn;
              p_Var10 = ark_mem->ycur;
            }
          }
          bVar7 = local_54 == 2 && uVar13 != uVar11;
          iVar4 = mriStep_StageERKFast
                            (ark_mem,step_mem,sVar15,ark_mem->h * local_50 + sVar15,p_Var10,
                             (N_Vector)(ulong)CONCAT31((int3)((uint)local_54 >> 8),bVar7),
                             (uint)bVar7);
          if (iVar4 != 0) {
            *nflagPtr = 4;
            return iVar4;
          }
          ark_mem->tcur = local_50 * ark_mem->h + ark_mem->tn;
          if (step_mem->implicit_rhs == 0) {
LAB_00157c48:
            uVar9 = 0;
          }
          else {
            if (ABS((*step_mem->MRIC->G)[uVar13][uVar13]) <= 2.220446049250313e-14) {
              *step_mem->cvals = 1.0;
              *step_mem->Xvecs = ark_mem->ycur;
              uVar6 = 0;
              do {
                step_mem->cvals[uVar6 + 1] = ark_mem->h * (*step_mem->MRIC->G)[uVar13][uVar6];
                step_mem->Xvecs[uVar6 + 1] = step_mem->Fsi[uVar6];
                uVar6 = uVar6 + 1;
              } while (uVar13 != uVar6);
              iVar4 = N_VLinearCombination(iVar5 + 1,step_mem->cvals,step_mem->Xvecs);
              if (iVar4 != 0) {
                return -0x1c;
              }
              goto LAB_00157c48;
            }
            iVar4 = iVar5 - (uint)(uVar13 == (uint)step_mem->stages);
            step_mem->istage = iVar4;
            iVar4 = mriStep_Predict(ark_mem,iVar4,step_mem->zpred);
            if (iVar4 != 0) {
              return iVar4;
            }
            if (step_mem->stage_predict != (ARKStagePredictFn)0x0) {
              iVar4 = (*step_mem->stage_predict)(ark_mem->tcur,step_mem->zpred,ark_mem->user_data);
              if (iVar4 < 0) {
                return -0x27;
              }
              if (iVar4 != 0) {
                return 5;
              }
            }
            *step_mem->cvals = 1.0;
            *step_mem->Xvecs = ark_mem->ycur;
            step_mem->cvals[1] = -1.0;
            step_mem->Xvecs[1] = step_mem->zpred;
            uVar6 = 0;
            do {
              step_mem->cvals[uVar6 + 2] = ark_mem->h * (*step_mem->MRIC->G)[uVar13][uVar6];
              step_mem->Xvecs[uVar6 + 2] = step_mem->Fsi[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar13 != uVar6);
            p_Var10 = step_mem->sdata;
            iVar4 = N_VLinearCombination(iVar5 + 2,step_mem->cvals,step_mem->Xvecs,p_Var10);
            if (iVar4 != 0) {
              return -0x1c;
            }
            dVar14 = ark_mem->h * (*step_mem->MRIC->G)[uVar13][uVar13];
            step_mem->gamma = dVar14;
            if (ark_mem->firststage == 0) {
              sVar15 = dVar14 / step_mem->gammap;
            }
            else {
              step_mem->gammap = dVar14;
              sVar15 = 1.0;
            }
            step_mem->gamrat = sVar15;
            iVar4 = mriStep_Nls(ark_mem,*nflagPtr);
            *nflagPtr = iVar4;
            uVar9 = (undefined4)CONCAT71((int7)((ulong)p_Var10 >> 8),1);
            if (iVar4 != 0) {
              return 5;
            }
          }
          local_50 = (double)CONCAT44(local_50._4_4_,uVar9);
          if (ark_mem->ProcessStage != (ARKPostProcessFn)0x0) {
            iVar4 = (*ark_mem->ProcessStage)(ark_mem->tcur,ark_mem->ycur,ark_mem->user_data);
            if (iVar4 != 0) {
              return -0x26;
            }
            p_Var12 = step_mem->stepper;
            if ((p_Var12 == (MRIStepInnerStepper)0x0) ||
               (p_Var12->ops == (MRIStepInnerStepper_Ops)0x0)) {
LAB_00157f83:
              msgfmt = "Unable to reset the inner stepper";
              iVar5 = -0x22;
              error_code = -0x22;
              iVar4 = 0xa28;
              goto LAB_0015777b;
            }
            p_Var3 = p_Var12->ops->reset;
            if (p_Var3 != (MRIStepInnerResetFn)0x0) {
              iVar4 = (*p_Var3)(p_Var12,ark_mem->tcur,ark_mem->ycur);
              p_Var12->last_flag = iVar4;
              if (iVar4 != 0) goto LAB_00157f83;
            }
          }
          uVar6 = (ulong)(uVar8 - 1);
          if (uVar13 != uVar6 && uVar13 != uVar11) {
            if (step_mem->explicit_rhs != 0) {
              iVar4 = (*step_mem->fse)(ark_mem->tcur,ark_mem->ycur,step_mem->Fse[uVar13],
                                       ark_mem->user_data);
              step_mem->nfse = step_mem->nfse + 1;
              if (iVar4 < 0) {
                return -8;
              }
              if (iVar4 != 0) {
                return -0xb;
              }
              if (step_mem->expforcing != 0) {
                *step_mem->cvals = 1.0;
                *step_mem->Xvecs = step_mem->Fse[uVar13];
                local_58 = 1;
                mriStep_ApplyForcing(step_mem,ark_mem->tcur,1.0,&local_58);
                N_VLinearCombination(local_58,step_mem->cvals,step_mem->Xvecs,step_mem->Fse[uVar13])
                ;
              }
            }
            if (step_mem->implicit_rhs != 0) {
              if ((local_50._0_1_ & step_mem->deduce_rhs != 0) == 0) {
                iVar4 = (*step_mem->fsi)(ark_mem->tcur,ark_mem->ycur,step_mem->Fsi[uVar13],
                                         ark_mem->user_data);
                step_mem->nfsi = step_mem->nfsi + 1;
                if (iVar4 < 0) {
                  return -8;
                }
                if (iVar4 != 0) {
                  return -0xb;
                }
                if (step_mem->impforcing != 0) {
                  *step_mem->cvals = 1.0;
                  *step_mem->Xvecs = step_mem->Fsi[uVar13];
                  local_58 = 1;
                  mriStep_ApplyForcing(step_mem,ark_mem->tcur,1.0,&local_58);
                  N_VLinearCombination
                            (local_58,step_mem->cvals,step_mem->Xvecs,step_mem->Fsi[uVar13]);
                }
              }
              else {
                N_VLinearSum(1.0 / step_mem->gamma,-1.0 / step_mem->gamma,step_mem->zcor,
                             step_mem->sdata,step_mem->Fsi[uVar13]);
              }
              if ((step_mem->implicit_rhs != 0) && (step_mem->explicit_rhs != 0)) {
                N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,step_mem->Fse[uVar13],
                             step_mem->Fsi[uVar13],step_mem->Fse[uVar13]);
              }
            }
          }
          p_Var10 = local_48;
          if (uVar13 == uVar6) {
            N_VScale(0x3ff0000000000000,ark_mem->ycur,local_48);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != local_40);
        iVar4 = ark_mem->fixedstep;
      }
      if ((iVar4 == 0) || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) {
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,p_Var10,ark_mem->ycur,ark_mem->tempv1);
        sVar15 = (sunrealtype)N_VWrmsNorm(ark_mem->tempv1,ark_mem->ewt);
        *local_38 = sVar15;
        N_VScale(0x3ff0000000000000,p_Var10,ark_mem->ycur);
      }
      return 0;
    }
    iVar5 = (*p_Var1->reseterror)(p_Var12);
    p_Var12->last_flag = iVar5;
    if (iVar5 == 0) {
      p_Var12 = step_mem->stepper;
      if (p_Var12 != (MRIStepInnerStepper)0x0) goto LAB_00157692;
      goto LAB_001576bf;
    }
  }
  msgfmt = "Unable to reset the inner stepper error estimate";
  iVar5 = -0x22;
  error_code = -0x22;
  iVar4 = 0x912;
LAB_0015777b:
  arkProcessError(ark_mem,error_code,iVar4,"mriStep_TakeStepMRISR",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                  ,msgfmt);
  return iVar5;
}

Assistant:

int mriStep_TakeStepMRISR(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  ARKodeMRIStepMem step_mem;          /* outer stepper memory       */
  int stage, j;                       /* stage indices              */
  int retval;                         /* reusable return flag       */
  N_Vector ytilde;                    /* embedded solution          */
  N_Vector ytemp;                     /* temporary vector           */
  SUNAdaptController_Type adapt_type; /* timestep adaptivity type   */
  sunbooleantype embedding;           /* flag indicating embedding  */
  sunbooleantype solution;            /*   or solution stages       */
  sunbooleantype impl_corr;           /* is slow correct. implicit? */
  sunrealtype cstage;                 /* current stage abscissa     */
  sunbooleantype need_inner_dsm;
  sunbooleantype nested_mri;
  int nvec, max_stages;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* access the MRIStep mem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* initialize algebraic solver convergence flag to success;
     error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr   = ZERO;

  /* set N_Vector shortcuts */
  ytilde = ark_mem->tempv4;
  ytemp  = ark_mem->tempv2;

  /* if MRI adaptivity is enabled: reset fast accumulated error,
     and send appropriate control parameter to the fast integrator */
  adapt_type     = SUNAdaptController_GetType(ark_mem->hadapt_mem->hcontroller);
  need_inner_dsm = SUNFALSE;
  if (adapt_type == SUN_ADAPTCONTROLLER_MRI_H_TOL)
  {
    need_inner_dsm      = SUNTRUE;
    step_mem->inner_dsm = ZERO;
    retval = mriStepInnerStepper_ResetAccumulatedError(step_mem->stepper);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to reset the inner stepper error estimate");
      return (ARK_INNERSTEP_FAIL);
    }
    retval = mriStepInnerStepper_SetRTol(step_mem->stepper,
                                         step_mem->inner_rtol_factor *
                                           ark_mem->reltol);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to set the inner stepper tolerance");
      return (ARK_INNERSTEP_FAIL);
    }
  }

  /* for adaptive computations, reset the inner integrator to the beginning of this step */
  if (!ark_mem->fixedstep)
  {
    retval = mriStepInnerStepper_Reset(step_mem->stepper, ark_mem->tn,
                                       ark_mem->yn);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to reset the inner stepper");
      return (ARK_INNERSTEP_FAIL);
    }
  }

  SUNLogInfo(ARK_LOGGER, "begin-stage",
             "stage = 0, stage type = %d, tcur = " SUN_FORMAT_G, MRISTAGE_FIRST,
             ark_mem->tcur);
  SUNLogExtraDebugVec(ARK_LOGGER, "slow stage", ark_mem->ycur, "z_0(:) =");

  /* Evaluate the slow RHS functions if needed. NOTE: we decide between calling the
     full RHS function (if ark_mem->fn is non-NULL and MRIStep is not an inner
     integrator) versus just updating the stored values of Fse[0] and Fsi[0].  In
     either case, we use ARK_FULLRHS_START mode because MRISR methods do not
     evaluate the RHS functions at the end of the time step (so nothing can be
     leveraged). */
  nested_mri = step_mem->expforcing || step_mem->impforcing;
  if (ark_mem->fn == NULL || nested_mri)
  {
    retval = mriStep_UpdateF0(ark_mem, step_mem, ark_mem->tn, ark_mem->yn,
                              ARK_FULLRHS_START);
    if (retval)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed update F0 eval, retval = %i", retval);
      return ARK_RHSFUNC_FAIL;
    }

    /* For a nested MRI configuration we might still need fn to create a predictor
       but it should be fn only for the current nesting level which is why we use
       UpdateF0 in this case rather than FullRHS */
    if (ark_mem->fn != NULL && nested_mri && step_mem->implicit_rhs)
    {
      if (step_mem->implicit_rhs && step_mem->explicit_rhs)
      {
        N_VLinearSum(ONE, step_mem->Fsi[0], ONE, step_mem->Fse[0], ark_mem->fn);
      }
      else { N_VScale(ONE, step_mem->Fsi[0], ark_mem->fn); }
    }
  }
  if (ark_mem->fn != NULL && !ark_mem->fn_is_current)
  {
    retval = mriStep_FullRHS(ark_mem, ark_mem->tn, ark_mem->yn, ark_mem->fn,
                             ARK_FULLRHS_START);
    if (retval)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed full rhs eval, retval = %i", retval);
      return ARK_RHSFUNC_FAIL;
    }
  }
  ark_mem->fn_is_current = SUNTRUE;

  SUNLogExtraDebugVecIf(step_mem->explicit_rhs, ARK_LOGGER, "slow explicit RHS",
                        step_mem->Fse[0], "Fse_0(:) =");
  SUNLogExtraDebugVecIf(step_mem->implicit_rhs, ARK_LOGGER, "slow implicit RHS",
                        step_mem->Fsi[0], "Fsi_0(:) =");
  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  /* combine both RHS into FSE for ImEx problems, since MRISR fast forcing function
     only depends on Omega coefficients  */
  if (step_mem->implicit_rhs && step_mem->explicit_rhs)
  {
    N_VLinearSum(ONE, step_mem->Fse[0], ONE, step_mem->Fsi[0], step_mem->Fse[0]);
  }

  /* The first stage is the previous time-step solution, so its RHS
     is the [already-computed] slow RHS from the start of the step */

  /* Determine how many stages will be needed */
  max_stages = (ark_mem->fixedstep &&
                (ark_mem->AccumErrorType == ARK_ACCUMERROR_NONE))
                 ? step_mem->stages
                 : step_mem->stages + 1;

  /* Loop over stages */
  for (stage = 1; stage < max_stages; stage++)
  {
    /* Determine if this is an "embedding" or "solution" stage */
    solution  = (stage == step_mem->stages - 1);
    embedding = (stage == step_mem->stages);

    /* Set initial condition for this stage */
    N_VScale(ONE, ark_mem->yn, ark_mem->ycur);

    /* Set current stage abscissa */
    cstage = (embedding) ? ONE : step_mem->MRIC->c[stage];

    SUNLogInfo(ARK_LOGGER, "begin-stage",
               "stage = %i, stage type = %d, tcur = " SUN_FORMAT_G, stage,
               MRISTAGE_ERK_FAST, ark_mem->tn + cstage * ark_mem->h);

    /* Compute forcing function for inner solver */
    retval = mriStep_ComputeInnerForcing(ark_mem, step_mem, stage, ark_mem->tn,
                                         ark_mem->tn + cstage * ark_mem->h);
    if (retval != ARK_SUCCESS)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed forcing computation, retval = %i", retval);
      return retval;
    }

    /* Reset the inner stepper on all but the first stage due to
       "stage-restart" structure */
    if (stage > 1)
    {
      retval = mriStepInnerStepper_Reset(step_mem->stepper, ark_mem->tn,
                                         ark_mem->ycur);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed reset, retval = %i", retval);
        arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__,
                        __FILE__, "Unable to reset the inner stepper");
        return (ARK_INNERSTEP_FAIL);
      }
    }

    /* Evolve fast IVP for this stage, potentially get inner dsm on
       all non-embedding stages */
    retval = mriStep_StageERKFast(ark_mem, step_mem, ark_mem->tn,
                                  ark_mem->tn + cstage * ark_mem->h,
                                  ark_mem->ycur, ytemp,
                                  need_inner_dsm && !embedding);
    if (retval != ARK_SUCCESS)
    {
      *nflagPtr = CONV_FAIL;
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed fast ERK stage, retval = %i", retval);
      return retval;
    }

    /* set current stage time for implicit correction, postprocessing
       and RHS calls */
    ark_mem->tcur = ark_mem->tn + cstage * ark_mem->h;

    /* perform MRISR slow/implicit correction */
    impl_corr = SUNFALSE;
    if (step_mem->implicit_rhs)
    {
      /* determine whether implicit RHS correction will require an implicit solve */
      impl_corr = SUNRabs(step_mem->MRIC->G[0][stage][stage]) > tol;

      /* perform implicit solve for correction */
      if (impl_corr)
      {
        /* store current stage index (for an "embedded" stage, subtract 1) */
        step_mem->istage = (stage == step_mem->stages) ? stage - 1 : stage;

        /* Call predictor for current stage solution (result placed in zpred) */
        retval = mriStep_Predict(ark_mem, step_mem->istage, step_mem->zpred);
        if (retval != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed predict, retval = %i", retval);
          return (retval);
        }

        /* If a user-supplied predictor routine is provided, call that here
           Note that mriStep_Predict is *still* called, so this user-supplied
           routine can just "clean up" the built-in prediction, if desired. */
        if (step_mem->stage_predict)
        {
          retval = step_mem->stage_predict(ark_mem->tcur, step_mem->zpred,
                                           ark_mem->user_data);

          SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                       "status = failed predict, retval = %i", retval);
          if (retval < 0) { return (ARK_USER_PREDICT_FAIL); }
          if (retval > 0) { return (TRY_AGAIN); }
        }

        SUNLogExtraDebugVec(ARK_LOGGER, "predictor", step_mem->zpred,
                            "zpred(:) =");

        /* fill sdata with explicit contributions to correction */
        step_mem->cvals[0] = ONE;
        step_mem->Xvecs[0] = ark_mem->ycur;
        step_mem->cvals[1] = -ONE;
        step_mem->Xvecs[1] = step_mem->zpred;
        for (j = 0; j < stage; j++)
        {
          step_mem->cvals[j + 2] = ark_mem->h * step_mem->MRIC->G[0][stage][j];
          step_mem->Xvecs[j + 2] = step_mem->Fsi[j];
        }
        retval = N_VLinearCombination(stage + 2, step_mem->cvals,
                                      step_mem->Xvecs, step_mem->sdata);
        if (retval != 0)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed vector op, retval = %i", retval);
          return (ARK_VECTOROP_ERR);
        }

        SUNLogExtraDebugVec(ARK_LOGGER, "rhs data", step_mem->sdata,
                            "sdata(:) =");

        /* Update gamma for implicit solver */
        step_mem->gamma = ark_mem->h * step_mem->MRIC->G[0][stage][stage];
        if (ark_mem->firststage) { step_mem->gammap = step_mem->gamma; }
        step_mem->gamrat =
          (ark_mem->firststage) ? ONE : step_mem->gamma / step_mem->gammap;

        /* perform implicit solve (result is stored in ark_mem->ycur); return
           with positive value on anything but success */
        *nflagPtr = mriStep_Nls(ark_mem, *nflagPtr);
        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }
      /* perform explicit update for correction */
      else
      {
        step_mem->cvals[0] = ONE;
        step_mem->Xvecs[0] = ark_mem->ycur;
        for (j = 0; j < stage; j++)
        {
          step_mem->cvals[j + 1] = ark_mem->h * step_mem->MRIC->G[0][stage][j];
          step_mem->Xvecs[j + 1] = step_mem->Fsi[j];
        }
        retval = N_VLinearCombination(stage + 1, step_mem->cvals,
                                      step_mem->Xvecs, ark_mem->ycur);
        if (retval != 0)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed vector op, retval = %i", retval);
          return (ARK_VECTOROP_ERR);
        }
      }
    }

    SUNLogExtraDebugVec(ARK_LOGGER, "slow stage", ark_mem->ycur,
                        "z_%i(:) =", stage);

    /* apply user-supplied stage postprocessing function (if supplied),
       and reset the inner integrator with the modified stage solution */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur, ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return (ARK_POSTPROCESS_STAGE_FAIL);
      }
      retval = mriStepInnerStepper_Reset(step_mem->stepper, ark_mem->tcur,
                                         ark_mem->ycur);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed reset, retval = %i", retval);
        arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__,
                        __FILE__, "Unable to reset the inner stepper");
        return (ARK_INNERSTEP_FAIL);
      }
    }

    /* Compute updated slow RHS (except for final solution or embedding) */
    if ((!solution) && (!embedding))
    {
      /* store explicit slow rhs */
      if (step_mem->explicit_rhs)
      {
        retval = step_mem->fse(ark_mem->tcur, ark_mem->ycur,
                               step_mem->Fse[stage], ark_mem->user_data);
        step_mem->nfse++;

        SUNLogExtraDebugVec(ARK_LOGGER, "slow explicit RHS",
                            step_mem->Fse[stage], "Fse_%i(:) =", stage);
        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed explicit rhs eval, retval = %i", retval);

        if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
        if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }

        /* Add external forcing to Fse[stage], if applicable */
        if (step_mem->expforcing)
        {
          step_mem->cvals[0] = ONE;
          step_mem->Xvecs[0] = step_mem->Fse[stage];
          nvec               = 1;
          mriStep_ApplyForcing(step_mem, ark_mem->tcur, ONE, &nvec);
          N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                               step_mem->Fse[stage]);
        }
      }

      /* store implicit slow rhs */
      if (step_mem->implicit_rhs)
      {
        if (!step_mem->deduce_rhs || !impl_corr)
        {
          retval = step_mem->fsi(ark_mem->tcur, ark_mem->ycur,
                                 step_mem->Fsi[stage], ark_mem->user_data);
          step_mem->nfsi++;

          SUNLogExtraDebugVec(ARK_LOGGER, "slow implicit RHS",
                              step_mem->Fsi[stage], "Fsi_%i(:) =", stage);
          SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                       "status = failed implicit rhs eval, retval = %i", retval);

          if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
          if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }

          /* Add external forcing to Fsi[stage], if applicable */
          if (step_mem->impforcing)
          {
            step_mem->cvals[0] = ONE;
            step_mem->Xvecs[0] = step_mem->Fsi[stage];
            nvec               = 1;
            mriStep_ApplyForcing(step_mem, ark_mem->tcur, ONE, &nvec);
            N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                                 step_mem->Fsi[stage]);
          }
        }
        else
        {
          N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                       -ONE / step_mem->gamma, step_mem->sdata,
                       step_mem->Fsi[stage]);

          SUNLogExtraDebugVec(ARK_LOGGER, "slow implicit RHS",
                              step_mem->Fsi[stage], "Fsi_%i(:) =", stage);
        }
      }

      /* combine both RHS into Fse for ImEx problems since
         fast forcing function only depends on Omega coefficients */
      if (step_mem->implicit_rhs && step_mem->explicit_rhs)
      {
        N_VLinearSum(ONE, step_mem->Fse[stage], ONE, step_mem->Fsi[stage],
                     step_mem->Fse[stage]);
      }
    }

    /* If this is the solution stage, archive for error estimation */
    if (solution) { N_VScale(ONE, ark_mem->ycur, ytilde); }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  } /* loop over stages */

  /* if temporal error estimation is enabled: compute estimate via difference between
     step solution and embedding, store in ark_mem->tempv1, store norm in dsmPtr, and
     copy solution back to ycur */
  if (!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE))
  {
    N_VLinearSum(ONE, ytilde, -ONE, ark_mem->ycur, ark_mem->tempv1);
    *dsmPtr = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);
    N_VScale(ONE, ytilde, ark_mem->ycur);
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");

  return (ARK_SUCCESS);
}